

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

int __thiscall smf::Options::define(Options *this,string *aDefinition)

{
  char cVar1;
  pointer ppOVar2;
  pointer ppOVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  Option_register *this_00;
  mapped_type *pmVar8;
  ostream *poVar9;
  uint uVar10;
  int iVar11;
  string optionName;
  Option_register *definitionEntry;
  string otype;
  string rest;
  string aliases;
  string ovalue;
  string local_50;
  
  definitionEntry = (Option_register *)0x0;
  lVar6 = std::__cxx11::string::find((char *)aDefinition,0x129300);
  if (lVar6 == -1) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Error: no \"=\" in option definition: ");
    poVar9 = std::operator<<(poVar9,(string *)aDefinition);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    std::__cxx11::string::substr((ulong)&aliases,(ulong)aDefinition);
    std::__cxx11::string::substr((ulong)&rest,(ulong)aDefinition);
    std::__cxx11::string::string((string *)&otype,(string *)&rest);
    std::__cxx11::string::string((string *)&ovalue,"",(allocator *)&optionName);
    lVar6 = std::__cxx11::string::find((char *)&rest,0x12914f);
    if (lVar6 != -1) {
      std::__cxx11::string::substr((ulong)&optionName,(ulong)&rest);
      std::__cxx11::string::operator=((string *)&otype,(string *)&optionName);
      std::__cxx11::string::~string((string *)&optionName);
      std::__cxx11::string::substr((ulong)&optionName,(ulong)&rest);
      std::__cxx11::string::operator=((string *)&ovalue,(string *)&optionName);
      std::__cxx11::string::~string((string *)&optionName);
    }
    _Var7 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )otype._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(otype._M_dataplus._M_p + otype._M_string_length),
                       (_Iter_pred<int_(*)(int)>)isspace);
    std::__cxx11::string::erase
              (&otype,_Var7._M_current,otype._M_dataplus._M_p + otype._M_string_length);
    if (otype._M_string_length == 1) {
      if (((byte)*otype._M_dataplus._M_p - 0x62 < 0x12) &&
         ((0x20097U >> ((byte)*otype._M_dataplus._M_p - 0x62 & 0x1f) & 1) != 0)) {
        this_00 = (Option_register *)operator_new(0x88);
        Option_register::Option_register(this_00,aDefinition,*otype._M_dataplus._M_p,&ovalue);
        ppOVar2 = (this->m_optionRegister).
                  super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppOVar3 = (this->m_optionRegister).
                  super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        optionName._M_dataplus._M_p = (pointer)&optionName.field_2;
        optionName._M_string_length = 0;
        optionName.field_2._M_local_buf[0] = '\0';
        definitionEntry = this_00;
        std::__cxx11::string::push_back((char)&aliases);
        uVar10 = 0;
        do {
          iVar11 = (int)((ulong)((long)ppOVar2 - (long)ppOVar3) >> 3);
          if (aliases._M_string_length <= uVar10) {
            std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::push_back
                      (&this->m_optionRegister,&definitionEntry);
            std::__cxx11::string::~string((string *)&optionName);
            std::__cxx11::string::~string((string *)&ovalue);
            std::__cxx11::string::~string((string *)&otype);
            std::__cxx11::string::~string((string *)&rest);
            std::__cxx11::string::~string((string *)&aliases);
            return iVar11;
          }
          cVar1 = aliases._M_dataplus._M_p[uVar10];
          iVar5 = isspace((int)cVar1);
          if (iVar5 == 0) {
            if (cVar1 == '|') {
              bVar4 = isDefined(this,&optionName);
              if (bVar4) {
                poVar9 = std::operator<<((ostream *)&std::cerr,"Option \"");
                poVar9 = std::operator<<(poVar9,(string *)&optionName);
                poVar9 = std::operator<<(poVar9,"\" from definition:");
                std::endl<char,std::char_traits<char>>(poVar9);
                poVar9 = std::operator<<((ostream *)&std::cerr,"\t");
                poVar9 = std::operator<<(poVar9,(string *)aDefinition);
                std::endl<char,std::char_traits<char>>(poVar9);
                poVar9 = std::operator<<((ostream *)&std::cerr,"is already defined in: ");
                std::endl<char,std::char_traits<char>>(poVar9);
                poVar9 = std::operator<<((ostream *)&std::cerr,"\t");
                getDefinition(&local_50,this,&optionName);
                poVar9 = std::operator<<(poVar9,(string *)&local_50);
                std::endl<char,std::char_traits<char>>(poVar9);
                std::__cxx11::string::~string((string *)&local_50);
                goto LAB_001176bd;
              }
              if (optionName._M_string_length != 0) {
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::operator[](&this->m_optionList,&optionName);
                *pmVar8 = iVar11;
              }
              optionName._M_string_length = 0;
              *optionName._M_dataplus._M_p = '\0';
            }
            else {
              std::__cxx11::string::push_back((char)&optionName);
            }
          }
          uVar10 = uVar10 + 1;
        } while( true );
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,"Error: unknown option type \'");
      poVar9 = std::operator<<(poVar9,*otype._M_dataplus._M_p);
      poVar9 = std::operator<<(poVar9,"\' in defintion: ");
      poVar9 = std::operator<<(poVar9,(string *)aDefinition);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Error: option type is invalid: ");
      poVar9 = std::operator<<(poVar9,(string *)&otype);
      poVar9 = std::operator<<(poVar9," in option definition: ");
      poVar9 = std::operator<<(poVar9,(string *)aDefinition);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
LAB_001176bd:
  exit(1);
}

Assistant:

int Options::define(const std::string& aDefinition) {
	Option_register* definitionEntry = NULL;

	// Error if definition string doesn't contain an equals sign
	auto location = aDefinition.find("=");
	if (location == std::string::npos) {
		std::cerr << "Error: no \"=\" in option definition: " << aDefinition << std::endl;
		exit(1);
	}

	std::string aliases = aDefinition.substr(0, location);
	std::string rest    = aDefinition.substr(location+1);
	std::string otype   = rest;
	std::string ovalue  = "";

	location = rest.find(":");
	if (location != std::string::npos) {
		otype  = rest.substr(0, location);
		ovalue = rest.substr(location+1);
	}

	// Remove any spaces in the option type field
	otype.erase(remove_if(otype.begin(), otype.end(), ::isspace), otype.end());

	// Option types are only a single charater (b, i, d, c or s)
	if (otype.size() != 1) {
		std::cerr << "Error: option type is invalid: " << otype
			  << " in option definition: " << aDefinition << std::endl;
		exit(1);
	}

	// Check to make sure that the type is known
	if (otype[0] != OPTION_TYPE_string  &&
		 otype[0] != OPTION_TYPE_int     &&
		 otype[0] != OPTION_TYPE_float   &&
		 otype[0] != OPTION_TYPE_double  &&
		 otype[0] != OPTION_TYPE_boolean &&
		 otype[0] != OPTION_TYPE_char ) {
		std::cerr << "Error: unknown option type \'" << otype[0]
			  << "\' in defintion: " << aDefinition << std::endl;
		exit(1);
	}

	// Set up space for a option entry in the register
	definitionEntry = new Option_register(aDefinition, otype[0], ovalue);

	int definitionIndex = (int)m_optionRegister.size();

	// Store option aliases
	std::string optionName;
	unsigned int i;
	aliases += '|';
	for (i=0; i<aliases.size(); i++) {
		if (::isspace(aliases[i])) {
			continue;
		} else if (aliases[i] == '|') {
			if (isDefined(optionName)) {
				std::cerr << "Option \"" << optionName << "\" from definition:" << std::endl;
				std::cerr << "\t" << aDefinition << std::endl;
				std::cerr << "is already defined in: " << std::endl;
				std::cerr << "\t" << getDefinition(optionName) << std::endl;
				exit(1);
			}
			if (optionName.size() > 0) {
				m_optionList[optionName] = definitionIndex;
			}
			optionName.clear();
		} else {
			optionName += aliases[i];
		}
	}

	// Store definition in register and return its indexed location.
	// This location will be used to link option aliases to the main
	// command name.
	m_optionRegister.push_back(definitionEntry);
	return definitionIndex;
}